

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_quaternion rf_quaternion_invert(rf_quaternion q)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  rf_quaternion rVar9;
  undefined8 uVar5;
  
  uVar5 = q._8_8_;
  uVar2 = q._0_8_;
  fVar4 = q.z;
  fVar6 = q.w;
  fVar1 = q.x;
  fVar3 = q.y;
  fVar7 = SQRT(fVar6 * fVar6 + fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3);
  fVar7 = fVar7 * fVar7;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    fVar8 = -(1.0 / fVar7);
    uVar2 = CONCAT44(fVar3 * fVar8,fVar1 * fVar8);
    uVar5 = CONCAT44(fVar6 * (1.0 / fVar7),fVar4 * fVar8);
  }
  rVar9.z = (float)(int)uVar5;
  rVar9.w = (float)(int)((ulong)uVar5 >> 0x20);
  rVar9.x = (float)(int)uVar2;
  rVar9.y = (float)(int)((ulong)uVar2 >> 0x20);
  return rVar9;
}

Assistant:

RF_API rf_quaternion rf_quaternion_invert(rf_quaternion q)
{
    rf_quaternion result = q;
    float length = rf_quaternion_len(q);
    float lengthSq = length * length;

    if (lengthSq != 0.0)
    {
        float i = 1.0f / lengthSq;

        result.x *= -i;
        result.y *= -i;
        result.z *= -i;
        result.w *= i;
    }

    return result;
}